

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmCTestBZR.cxx
# Opt level: O3

bool __thiscall cmCTestBZR::UpdateParser::ProcessChunk(UpdateParser *this,char *first,int length)

{
  string *psVar1;
  char *__s;
  bool bVar2;
  bool bVar3;
  int iVar4;
  size_t sVar5;
  ostream *poVar6;
  long lVar7;
  
  if (length != 0) {
    bVar3 = *first == '\n' || *first == '\r';
    psVar1 = &(this->super_LineParser).Line;
    lVar7 = 0;
    do {
      if ((first[lVar7] == '\r') || (first[lVar7] == '\n')) {
        bVar2 = !bVar3;
        bVar3 = true;
        if (bVar2) {
          poVar6 = (this->super_LineParser).Log;
          if ((poVar6 != (ostream *)0x0) &&
             (__s = (this->super_LineParser).Prefix, __s != (char *)0x0)) {
            sVar5 = strlen(__s);
            std::__ostream_insert<char,std::char_traits<char>>(poVar6,__s,sVar5);
            poVar6 = std::__ostream_insert<char,std::char_traits<char>>
                               (poVar6,(this->super_LineParser).Line._M_dataplus._M_p,
                                (this->super_LineParser).Line._M_string_length);
            std::__ostream_insert<char,std::char_traits<char>>(poVar6,"\n",1);
          }
          iVar4 = (*(this->super_LineParser).super_OutputParser._vptr_OutputParser[3])(this);
          std::__cxx11::string::_M_replace
                    ((ulong)psVar1,0,(char *)(this->super_LineParser).Line._M_string_length,0x66eafa
                    );
          if ((char)iVar4 == '\0') {
            return false;
          }
        }
      }
      else {
        bVar3 = false;
        std::__cxx11::string::_M_replace_aux
                  ((ulong)psVar1,(this->super_LineParser).Line._M_string_length,0,'\x01');
      }
      lVar7 = lVar7 + 1;
    } while (length != lVar7);
  }
  return true;
}

Assistant:

bool ProcessChunk(const char* first, int length) CM_OVERRIDE
  {
    bool last_is_new_line = (*first == '\r' || *first == '\n');

    const char* const last = first + length;
    for (const char* c = first; c != last; ++c) {
      if (*c == '\r' || *c == '\n') {
        if (!last_is_new_line) {
          // Log this line.
          if (this->Log && this->Prefix) {
            *this->Log << this->Prefix << this->Line << "\n";
          }

          // Hand this line to the subclass implementation.
          if (!this->ProcessLine()) {
            this->Line = "";
            return false;
          }

          this->Line = "";
          last_is_new_line = true;
        }
      } else {
        // Append this character to the line under construction.
        this->Line.append(1, *c);
        last_is_new_line = false;
      }
    }
    return true;
  }